

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

pfdistances * prepare_pfdistances(player *p,loc start,_Bool only_known,_Bool forbid_traps)

{
  loc grid_00;
  loc grid1;
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  int iVar8;
  void *pvVar9;
  queue *q;
  uintptr_t uVar10;
  loc_conflict grid_01;
  size_t sVar11;
  size_t sVar12;
  undefined4 uVar13;
  wchar_t local_7c;
  wchar_t local_68;
  wchar_t penalized_distance;
  wchar_t penalty;
  loc next;
  wchar_t i;
  wchar_t cur_distance;
  wchar_t tree_penalty;
  wchar_t prubble_penalty;
  wchar_t rubble_penalty;
  wchar_t locked_penalty;
  wchar_t unlocked_penalty;
  queue *pending;
  loc grid;
  pfdistances *result;
  _Bool forbid_traps_local;
  _Bool only_known_local;
  player *p_local;
  loc start_local;
  
  if ((p->cave == (chunk_conflict1 *)0x0) ||
     (_Var1 = square_in_bounds_fully((chunk *)p->cave,(loc_conflict)start), !_Var1)) {
    start_local.x = 0;
    start_local.y = 0;
  }
  else {
    grid = (loc)mem_alloc(0x20);
    pvVar9 = mem_alloc((long)(p->cave->height * p->cave->width) << 2);
    *(void **)grid = pvVar9;
    pvVar9 = mem_alloc((long)p->cave->height << 3);
    *(void **)((long)grid + 8) = pvVar9;
    *(loc *)((long)grid + 0x10) = start;
    *(wchar_t *)((long)grid + 0x18) = p->cave->height;
    *(wchar_t *)((long)grid + 0x1c) = p->cave->width;
    for (pending._4_4_ = 0; pending._4_4_ < *(int *)((long)grid + 0x18);
        pending._4_4_ = pending._4_4_ + 1) {
      *(long *)(*(long *)((long)grid + 8) + (long)pending._4_4_ * 8) =
           *(long *)grid + (long)(pending._4_4_ * *(int *)((long)grid + 0x1c)) * 4;
    }
    for (pending._0_4_ = 0; (int)pending < *(int *)((long)grid + 0x1c);
        pending._0_4_ = (int)pending + 1) {
      *(undefined4 *)(**(long **)((long)grid + 8) + (long)(int)pending * 4) = 0xffffffff;
    }
    for (pending._4_4_ = 1; pending._4_4_ < *(int *)((long)grid + 0x18) + -1;
        pending._4_4_ = pending._4_4_ + 1) {
      **(undefined4 **)(*(long *)((long)grid + 8) + (long)pending._4_4_ * 8) = 0xffffffff;
      for (pending._0_4_ = 1; (int)pending < *(int *)((long)grid + 0x1c) + -1;
          pending._0_4_ = (int)pending + 1) {
        grid_00.y = pending._4_4_;
        grid_00.x = (int)pending;
        _Var1 = is_valid_pf(p,grid_00,only_known,forbid_traps);
        uVar13 = 0xffffffff;
        if (_Var1) {
          uVar13 = 0x7fffffff;
        }
        *(undefined4 *)
         (*(long *)(*(long *)((long)grid + 8) + (long)pending._4_4_ * 8) + (long)(int)pending * 4) =
             uVar13;
      }
      *(undefined4 *)
       (*(long *)(*(long *)((long)grid + 8) + (long)pending._4_4_ * 8) +
       (long)(*(int *)((long)grid + 0x1c) + -1) * 4) = 0xffffffff;
    }
    for (pending._0_4_ = 0; (int)pending < *(int *)((long)grid + 0x1c);
        pending._0_4_ = (int)pending + 1) {
      *(undefined4 *)
       (*(long *)(*(long *)((long)grid + 8) + (long)(*(int *)((long)grid + 0x18) + -1) * 8) +
       (long)(int)pending * 4) = 0xffffffff;
    }
    *(undefined4 *)
     (*(long *)(*(long *)((long)grid + 8) + (long)*(int *)((long)grid + 0x14) * 8) +
     (long)*(int *)((long)grid + 0x10) * 4) = 0;
    wVar2 = compute_unlocked_penalty(p);
    wVar3 = compute_locked_penalty(p);
    wVar4 = compute_rubble_penalty(p);
    wVar5 = compute_passable_rubble_penalty(p);
    wVar6 = compute_tree_penalty(p);
    q = q_new((long)((*(int *)((long)grid + 0x1c) + *(int *)((long)grid + 0x18) + -2) * 2));
    wVar7 = grid_to_i(*(loc *)((long)grid + 0x10),*(wchar_t *)((long)grid + 0x1c));
    q_push(q,(long)wVar7);
    do {
      uVar10 = q_pop(q);
      i_to_grid((wchar_t)uVar10,*(wchar_t *)((long)grid + 0x1c),(loc *)&pending);
      iVar8 = *(int *)(*(long *)(*(long *)((long)grid + 8) + (long)pending._4_4_ * 8) +
                      (long)(int)pending * 4);
      if (iVar8 < 0x7fffffef) {
        iVar8 = iVar8 + 0x10;
        for (next.x = 0; next.x < 8; next.x = next.x + 1) {
          grid1.y = pending._4_4_;
          grid1.x = (int)pending;
          grid_01 = (loc_conflict)loc_sum(grid1,ddgrid_ddd[next.x]);
          penalty = grid_01.y;
          penalized_distance = grid_01.x;
          if (iVar8 < *(int *)(*(long *)(*(long *)((long)grid + 8) + (long)penalty * 8) +
                              (long)penalized_distance * 4)) {
            _Var1 = square_isknown((chunk *)p->cave,grid_01);
            if ((!_Var1) || (_Var1 = square_ispassable((chunk *)p->cave,grid_01), _Var1)) {
              *(int *)(*(long *)(*(long *)((long)grid + 8) + (long)penalty * 8) +
                      (long)penalized_distance * 4) = iVar8;
            }
            else {
              _Var1 = square_iscloseddoor((chunk *)p->cave,grid_01);
              if (_Var1) {
                _Var1 = square_islockeddoor((chunk *)p->cave,grid_01);
                local_7c = wVar3;
                if (!_Var1) {
                  local_7c = wVar2;
                }
                local_68 = local_7c;
              }
              else {
                _Var1 = square_isrubble((chunk *)p->cave,grid_01);
                if (_Var1) {
                  _Var1 = square_ispassable((chunk *)p->cave,grid_01);
                  local_68 = wVar5;
                  if (!_Var1) {
                    local_68 = wVar4;
                  }
                }
                else {
                  _Var1 = square_istree((chunk *)p->cave,grid_01);
                  local_68 = wVar6;
                  if (!_Var1) goto LAB_00200b13;
                }
              }
              if ((0x7fffffff - local_68 <= iVar8) ||
                 (*(int *)(*(long *)(*(long *)((long)grid + 8) + (long)penalty * 8) +
                          (long)penalized_distance * 4) <= iVar8 + local_68)) goto LAB_00200b13;
              *(wchar_t *)
               (*(long *)(*(long *)((long)grid + 8) + (long)penalty * 8) +
               (long)penalized_distance * 4) = iVar8 + local_68;
            }
            sVar12 = q_len(q);
            sVar11 = q_size(q);
            if ((sVar11 < sVar12) || (sVar12 = q_size(q), sVar12 == 0)) {
              __assert_fail("q_len(pending) <= q_size(pending) && q_size(pending) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                            ,0x1e9,
                            "struct pfdistances *prepare_pfdistances(struct player *, struct loc, _Bool, _Bool)"
                           );
            }
            sVar12 = q_len(q);
            sVar11 = q_size(q);
            if (sVar12 == sVar11) {
              sVar12 = q_size(q);
              if (sVar12 < 0x8000000000000000) {
                sVar12 = q_size(q);
                _Var1 = q_resize(q,sVar12 << 1);
                if (!_Var1) goto LAB_00200ae9;
              }
            }
            else {
LAB_00200ae9:
              wVar7 = grid_to_i((loc)grid_01,*(wchar_t *)((long)grid + 0x1c));
              q_push(q,(long)wVar7);
            }
          }
LAB_00200b13:
        }
      }
      sVar12 = q_len(q);
    } while (sVar12 != 0);
    q_free(q);
    start_local = grid;
  }
  return (pfdistances *)start_local;
}

Assistant:

struct pfdistances *prepare_pfdistances(struct player *p, struct loc start,
		bool only_known, bool forbid_traps)
{
	struct pfdistances *result;
	struct loc grid;
	struct queue *pending;
	int unlocked_penalty, locked_penalty, rubble_penalty, prubble_penalty,
		tree_penalty;

	if (!p->cave || !square_in_bounds_fully(p->cave, start)) {
		return NULL;
	}

	result = mem_alloc(sizeof(*result));
	result->buffer = mem_alloc(p->cave->height * p->cave->width
		* sizeof(*result->buffer));
	result->rows = mem_alloc(p->cave->height * sizeof(*result->rows));
	result->start = start;
	result->height = p->cave->height;
	result->width = p->cave->width;

	/* Set up the row pointers. */
	for (grid.y = 0; grid.y < result->height; ++grid.y) {
		result->rows[grid.y] = result->buffer + grid.y * result->width;
	}

	/*
	 * Mark the outer edge as unreachable (negative distance).  Keeps
	 * things in bounds without extra checks later.  Inner grids may
	 * be unreachable; otherwise they start with the assumption of
	 * the maximum possible distance.
	 */
	grid.y = 0;
	for (grid.x = 0; grid.x < result->width; ++grid.x) {
		result->rows[0][grid.x] = -1;
	}
	for (grid.y = 1; grid.y < result->height - 1; ++grid.y) {
		result->rows[grid.y][0] = -1;
		for (grid.x = 1; grid.x < result->width - 1; ++grid.x) {
			result->rows[grid.y][grid.x] = (is_valid_pf(p, grid,
				only_known, forbid_traps)) ?  INT_MAX : -1;
		}
		result->rows[grid.y][result->width - 1] = -1;
	}
	for (grid.x = 0; grid.x < result->width; ++grid.x) {
		result->rows[result->height - 1][grid.x] = -1;
	}

	/* The distance to the starting point is zero. */
	result->rows[result->start.y][result->start.x] = 0;

	/* Precompute quantities to penalize traversing some terrain;
	 * we ignore slowing in water and speedups in trees for now. */
	unlocked_penalty = compute_unlocked_penalty(p);
	locked_penalty = compute_locked_penalty(p);
	rubble_penalty = compute_rubble_penalty(p);
	prubble_penalty = compute_passable_rubble_penalty(p);
	tree_penalty = compute_tree_penalty(p);

	/*
	 * Set up a queue with the feasible points that remain to be
	 * considered.  The length of the perimeter of the cave is a guess
	 * at how many feasible points may be present at once.  Will try to
	 * resize if that turns out to be inadequate.
	 */
	pending = q_new(2 * (result->width + result->height - 2));
	/* The starting point is the point to consider. */
	q_push_int(pending, grid_to_i(result->start, result->width));

	/*
	 * For a feasible point, check the eight neighors to see if they
	 * are feasible.
	 */
	do {
		int cur_distance, i;

		i_to_grid(q_pop_int(pending), result->width, &grid);
		cur_distance = result->rows[grid.y][grid.x];
		/*
		 * Move one grid, i.e. PF_SCL, to get to the next grid.  If
		 * that exceeds the maximum distance possible, have no
		 * feasible points from the one under consideration.
		 */
		if (cur_distance >= INT_MAX - PF_SCL) {
			continue;
		}
		cur_distance += PF_SCL;

		/* Try the neighbors. */
		for (i = 0; i < 8; ++i) {
			struct loc next = loc_sum(grid, ddgrid_ddd[i]);

			/*
			 * Skip points that are unreachable or which have
			 * already been reached by a path which is at least
			 * as short as the path under consideration.
			 */
			if (result->rows[next.y][next.x] <= cur_distance) {
				continue;
			}
			/*
			 * Add next as a feasible point; penalize some terrain
			 * if it is known and hard to traverse.
			 */
			if (!square_isknown(p->cave, next)
					|| square_ispassable(p->cave, next)) {
				result->rows[next.y][next.x] = cur_distance;
			} else {
				int penalty, penalized_distance;

				if (square_iscloseddoor(p->cave, next)) {
					penalty = (square_islockeddoor(p->cave,
						next)) ? locked_penalty :
						unlocked_penalty;
				} else if (square_isrubble(p->cave, next)) {
					if (square_ispassable(p->cave, next)) {
						penalty = prubble_penalty;
					} else {
						penalty = rubble_penalty;
					}
				} else if (square_istree(p->cave, next)) {
					penalty = tree_penalty;
				} else {
					/*
					 * Should not happen, treat it as
					 * completely impassable.
					 */
					continue;
				}

				if (cur_distance >= INT_MAX - penalty) {
					/*
					 * Will exceed the maximum allowed
					 * distance so next is not feasible.
					 */
					continue;
				}
				penalized_distance = cur_distance + penalty;
				if (result->rows[next.y][next.x]
						<= penalized_distance) {
					/*
					 * Already have a path there that is
					 * shorter or the same length.  Do not
					 * need to consider this one.
					 */
					continue;
				}
				result->rows[next.y][next.x] =
					penalized_distance;
			}

			assert(q_len(pending) <= q_size(pending)
				&& q_size(pending) > 0);
			if (q_len(pending) == q_size(pending)) {
				if (q_size(pending) > SIZE_MAX / 2
						|| q_resize(pending,
						2 * q_size(pending))) {
					/*
					 * Can not hold the new pending
					 * feasible grid so skip it.
					 */
					continue;
				}
			}
			q_push_int(pending, grid_to_i(next, result->width));
		}
	} while (q_len(pending) > 0);

	q_free(pending);

	return result;
}